

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

fdb_status fdb_rollback(fdb_kvs_handle **handle_ptr,fdb_seqnum_t seqnum)

{
  __int_type_conflict _Var1;
  fdb_kvs_handle *handle;
  hbtrie *trie;
  btree *pbVar2;
  fdb_log_callback_ex p_Var3;
  fdb_status fVar4;
  fdb_status fVar5;
  fdb_kvs_handle *this;
  fdb_seqnum_t seqnum_00;
  size_t sVar6;
  btree_kv_ops *pbVar7;
  btree_kv_ops *handle_00;
  btree_kv_ops *handle_01;
  btree_kv_ops *trie_00;
  hbtrie_cmp_map *map_func;
  btree *pbVar8;
  err_log_callback *log_callback;
  fdb_kvs_id_t kv_id;
  bool bVar9;
  filemgr_open_result fVar10;
  hbtrie *local_200;
  hbtrie *local_1f0;
  uint sleep_time;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  filemgr_config fconfig;
  fdb_config config;
  
  if (handle_ptr == (fdb_kvs_handle **)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  handle = *handle_ptr;
  if (handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  memcpy(&config,&handle->config,0xf8);
  if (handle->kvs != (kvs_info *)0x0) {
    fVar4 = fdb_kvs_rollback(handle_ptr,seqnum);
    return fVar4;
  }
  if (((handle->config).flags & 2) != 0) {
    fVar4 = fdb_log_impl(&handle->log_callback,3,FDB_RESULT_RONLY_VIOLATION,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                         ,"fdb_rollback",0x4cd,
                         "Warning: Rollback is not allowed on the read-only DB file \'%s\'.",
                         handle->file->filename);
    return fVar4;
  }
  LOCK();
  bVar9 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
  if (bVar9) {
    (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
  }
  UNLOCK();
  if (!bVar9) {
    return FDB_RESULT_HANDLE_BUSY;
  }
  filemgr_mutex_lock(handle->file);
  filemgr_set_rollback(handle->file,'\x01');
  bVar9 = wal_txn_exists(handle->file);
  if (bVar9) {
    filemgr_set_rollback(handle->file,'\0');
    filemgr_mutex_unlock(handle->file);
    LOCK();
    if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
    }
    UNLOCK();
    return FDB_RESULT_FAIL_BY_TRANSACTION;
  }
  sleep_time = 10000;
  while( true ) {
    _Var1 = (handle->file->status).super___atomic_base<unsigned_char>._M_i;
    filemgr_mutex_unlock(handle->file);
    if (_Var1 != '\x01') break;
    decaying_usleep(&sleep_time,1000000);
    filemgr_mutex_lock(handle->file);
  }
  if (_Var1 == '\x04') {
    fdb_check_file_reopen(handle,(file_status_t *)0x0);
  }
  fdb_sync_db_header(handle);
  if (handle->seqnum < seqnum) {
    filemgr_set_rollback(handle->file,'\0');
    LOCK();
    if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
    }
    UNLOCK();
    return FDB_RESULT_NO_DB_INSTANCE;
  }
  this = (fdb_kvs_handle *)calloc(1,0x208);
  if (this == (fdb_kvs_handle *)0x0) {
    LOCK();
    if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
    }
    UNLOCK();
    return FDB_RESULT_ALLOC_FAIL;
  }
  LOCK();
  (this->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
  UNLOCK();
  (this->log_callback).ctx_data = (handle->log_callback).ctx_data;
  p_Var3 = (handle->log_callback).callback_ex;
  (this->log_callback).callback = (handle->log_callback).callback;
  (this->log_callback).callback_ex = p_Var3;
  this->fhandle = handle->fhandle;
  if (seqnum != 0) {
    this->max_seqnum = seqnum;
    fVar4 = _fdb_open(this,handle->file->filename,FDB_AFILENAME,&config);
    goto LAB_0012a6ca;
  }
  fVar4 = FDB_RESULT_ALLOC_FAIL;
  _fdb_kvs_handle::operator=(this,handle);
  LOCK();
  (this->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
  UNLOCK();
  sVar6 = strlen(handle->filename);
  pbVar7 = (btree_kv_ops *)malloc(sVar6 + 1);
  this->filename = (char *)pbVar7;
  if (pbVar7 == (btree_kv_ops *)0x0) goto LAB_0012a6ca;
  strcpy((char *)pbVar7,handle->filename);
  handle_00 = (btree_kv_ops *)calloc(1,0x78);
  if (handle_00 == (btree_kv_ops *)0x0) goto LAB_0012a6ca;
  log_callback = &this->log_callback;
  handle_00->set_key = (btree_print_func *)log_callback;
  handle_01 = (btree_kv_ops *)calloc(1,0x40);
  if (handle_01 == (btree_kv_ops *)0x0) {
LAB_0012a8b3:
    free(handle_00);
    handle_01 = pbVar7;
  }
  else {
    handle_01->init_kv_var = (btree_print_func *)log_callback;
    fVar5 = docio_init((docio_handle *)handle_01,this->file,(this->config).compress_document_body);
    if (fVar5 != FDB_RESULT_SUCCESS) {
      free(handle_00);
      free(handle_01);
      free(this->filename);
      fVar4 = fVar5;
      goto LAB_0012a6ca;
    }
    btreeblk_init((btreeblk_handle *)handle_00,this->file,this->file->blocksize);
    trie_00 = (btree_kv_ops *)malloc(0x70);
    if (trie_00 == (btree_kv_ops *)0x0) {
      free(this->filename);
      free(handle_00);
      goto LAB_0012a8bb;
    }
    hbtrie_init((hbtrie *)trie_00,(uint)this->trie->chunksize,(uint)this->trie->valuelen,
                this->file->blocksize,0xffffffffffffffff,handle_00,this->btreeblkops,handle_01,
                _fdb_readkey_wrap);
    hbtrie_set_leaf_cmp((hbtrie *)trie_00,_fdb_custom_cmp_wrap);
    trie = this->trie;
    *(uint8_t *)((long)&trie_00->get_kv + 2) = trie->flag;
    *(uint8_t *)((long)&trie_00->get_kv + 3) = trie->leaf_height_limit;
    map_func = hbtrie_get_map_function(trie);
    hbtrie_set_map_function((hbtrie *)trie_00,map_func);
    if ((this->config).seqtree_opt == '\x01') {
      if (this->kvs != (kvs_info *)0x0) {
        local_1f0 = (hbtrie *)calloc(1,0x70);
        if (local_1f0 == (hbtrie *)0x0) {
          free(this->filename);
          free(handle_00);
          free(handle_01);
          handle_01 = trie_00;
          goto LAB_0012a8bb;
        }
        hbtrie_init(local_1f0,8,8,this->file->blocksize,0xffffffffffffffff,handle_00,
                    this->btreeblkops,handle_01,_fdb_readseq_wrap);
        goto LAB_0012a9fc;
      }
      pbVar7 = (btree_kv_ops *)malloc(0x78);
      pbVar7 = btree_kv_get_kb64_vb64(pbVar7);
      pbVar7->cmp = _cmp_uint64_t_endian_safe;
      local_200 = (hbtrie *)calloc(1,0x38);
      if (local_200 == (hbtrie *)0x0) {
        free(this->filename);
        free(handle_00);
        free(handle_01);
        handle_00 = trie_00;
        goto LAB_0012a8b3;
      }
      pbVar8 = (this->field_6).seqtree;
      btree_init((btree *)local_200,handle_00,pbVar8->blk_ops,pbVar7,pbVar8->blksize,pbVar8->ksize,
                 pbVar8->vsize,0,(btree_meta *)0x0);
      local_1f0 = (hbtrie *)0x0;
    }
    else {
      local_1f0 = (hbtrie *)0x0;
LAB_0012a9fc:
      local_200 = (hbtrie *)0x0;
    }
    bVar9 = ver_staletree_support(0xdeadcafebeefc002);
    if (bVar9) {
      pbVar7 = (btree_kv_ops *)malloc(0x78);
      if (pbVar7 == (btree_kv_ops *)0x0) {
        free(this->filename);
        free(handle_00);
        free(handle_01);
        free(trie_00);
        if ((local_200 == (hbtrie *)0x0) || (this->kvs != (kvs_info *)0x0)) goto LAB_0012a6ca;
        handle_01 = (btree_kv_ops *)local_200->aux;
        goto LAB_0012a8bb;
      }
      pbVar7 = btree_kv_get_kb64_vb64(pbVar7);
      pbVar7->cmp = _cmp_uint64_t_endian_safe;
      pbVar2 = this->staletree;
      pbVar8 = (btree *)calloc(1,0x38);
      btree_init(pbVar8,handle_00,pbVar2->blk_ops,pbVar7,pbVar2->blksize,pbVar2->ksize,pbVar2->vsize
                 ,0,(btree_meta *)0x0);
    }
    else {
      pbVar8 = (btree *)0x0;
    }
    this->bhandle = (btreeblk_handle *)handle_00;
    this->dhandle = (docio_handle *)handle_01;
    this->trie = (hbtrie *)trie_00;
    if ((this->config).seqtree_opt == '\x01') {
      if (this->kvs == (kvs_info *)0x0) {
        local_1f0 = local_200;
      }
      (this->field_6).seqtrie = local_1f0;
    }
    this->staletree = pbVar8;
    _fdb_init_file_config(&this->config,&fconfig);
    fconfig.options = fconfig.options | 8;
    fVar10 = filemgr_open(this->filename,this->fileops,&fconfig,log_callback);
    fVar4 = fVar10.rv;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      wal_shutdown(this->file,log_callback);
      this->seqnum = 0;
      fVar4 = FDB_RESULT_SUCCESS;
      if (this->kvs == (kvs_info *)0x0) {
        kv_id = 0;
      }
      else {
        kv_id = this->kvs->id;
      }
      local_1a8 = 0;
      uStack_1a0 = 0;
      local_1b8 = 0;
      uStack_1b0 = 0;
      local_1c8 = 0;
      uStack_1c0 = 0;
      local_198 = 0;
      _kvs_stat_set(this->file,kv_id,(kvs_stat)ZEXT1656(ZEXT816(0)));
      goto LAB_0012a6ca;
    }
    filemgr_mutex_unlock(this->file);
    free(this->filename);
    free(handle_00);
    free(handle_01);
    free(trie_00);
    handle_01 = (btree_kv_ops *)(this->field_6).seqtree;
  }
LAB_0012a8bb:
  free(handle_01);
LAB_0012a6ca:
  filemgr_set_rollback(handle->file,'\0');
  if (fVar4 == FDB_RESULT_SUCCESS) {
    filemgr_mutex_lock(handle->file);
    seqnum_00 = filemgr_get_seqnum(handle->file);
    filemgr_set_seqnum(handle->file,seqnum);
    filemgr_mutex_unlock(handle->file);
    fVar4 = _fdb_commit(this,'\x01',((handle->config).durability_opt & 2) == 0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      if (handle->txn != (fdb_txn *)0x0) {
        this->txn = handle->txn;
        handle->txn = (fdb_txn *)0x0;
      }
      _fdb_kvs_close(handle);
      free(handle);
      _fdb_kvs_createNLinkKVHandle(this->fhandle,this);
      this->max_seqnum = 0;
      this->seqnum = seqnum;
      *handle_ptr = this;
      return FDB_RESULT_SUCCESS;
    }
    filemgr_mutex_lock(handle->file);
    filemgr_set_seqnum(handle->file,seqnum_00);
    filemgr_mutex_unlock(handle->file);
  }
  free(this);
  LOCK();
  if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
    (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
  }
  UNLOCK();
  return fVar4;
}

Assistant:

LIBFDB_API
fdb_status fdb_rollback(fdb_kvs_handle **handle_ptr, fdb_seqnum_t seqnum)
{
#ifdef _MEMPOOL
    mempool_init();
#endif

    fdb_config config;
    fdb_kvs_handle *handle_in, *handle;
    fdb_status fs;
    fdb_seqnum_t old_seqnum;

    if (!handle_ptr) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    handle_in = *handle_ptr;

    if (!handle_in) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    config = handle_in->config;

    if (handle_in->kvs) {
        return fdb_kvs_rollback(handle_ptr, seqnum);
    }

    if (handle_in->config.flags & FDB_OPEN_FLAG_RDONLY) {
        return fdb_log(&handle_in->log_callback, FDB_LOG_WARNING,
                       FDB_RESULT_RONLY_VIOLATION,
                       "Warning: Rollback is not allowed on the read-only DB file '%s'.",
                       handle_in->file->filename);
    }

    if (!atomic_cas_uint8_t(&handle_in->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    filemgr_mutex_lock(handle_in->file);
    filemgr_set_rollback(handle_in->file, 1); // disallow writes operations
    // All transactions should be closed before rollback
    if (wal_txn_exists(handle_in->file)) {
        filemgr_set_rollback(handle_in->file, 0);
        filemgr_mutex_unlock(handle_in->file);
        atomic_cas_uint8_t(&handle_in->handle_busy, 1, 0);
        return FDB_RESULT_FAIL_BY_TRANSACTION;
    }

    // If compaction is running, wait until it is aborted.
    // TODO: Find a better way of waiting for the compaction abortion.
    unsigned int sleep_time = 10000; // 10 ms.
    file_status_t fstatus = filemgr_get_file_status(handle_in->file);
    while (fstatus == FILE_COMPACT_OLD) {
        filemgr_mutex_unlock(handle_in->file);
        decaying_usleep(&sleep_time, 1000000);
        filemgr_mutex_lock(handle_in->file);
        fstatus = filemgr_get_file_status(handle_in->file);
    }
    if (fstatus == FILE_REMOVED_PENDING) {
        filemgr_mutex_unlock(handle_in->file);
        fdb_check_file_reopen(handle_in, NULL);
    } else {
        filemgr_mutex_unlock(handle_in->file);
    }

    fdb_sync_db_header(handle_in);

    // if the max sequence number seen by this handle is lower than the
    // requested snapshot marker, it means the snapshot is not yet visible
    // even via the current fdb_kvs_handle
    if (seqnum > handle_in->seqnum) {
        filemgr_set_rollback(handle_in->file, 0); // allow mutations
        atomic_cas_uint8_t(&handle_in->handle_busy, 1, 0);
        return FDB_RESULT_NO_DB_INSTANCE;
    }

    handle = (fdb_kvs_handle *) calloc(1, sizeof(fdb_kvs_handle));
    if (!handle) { // LCOV_EXCL_START
        atomic_cas_uint8_t(&handle_in->handle_busy, 1, 0);
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    atomic_init_uint8_t(&handle->handle_busy, 0);
    handle->log_callback = handle_in->log_callback;
    handle->fhandle = handle_in->fhandle;
    if (seqnum == 0) {
        fs = _fdb_reset(handle, handle_in);
    } else {
        handle->max_seqnum = seqnum;
        fs = _fdb_open(handle, handle_in->file->filename, FDB_AFILENAME,
                       &config);
    }

    filemgr_set_rollback(handle_in->file, 0); // allow mutations
    if (fs == FDB_RESULT_SUCCESS) {
        // rollback the file's sequence number
        filemgr_mutex_lock(handle_in->file);
        old_seqnum = filemgr_get_seqnum(handle_in->file);
        filemgr_set_seqnum(handle_in->file, seqnum);
        filemgr_mutex_unlock(handle_in->file);

        fs = _fdb_commit(handle, FDB_COMMIT_MANUAL_WAL_FLUSH,
                !(handle_in->config.durability_opt & FDB_DRB_ASYNC));
        if (fs == FDB_RESULT_SUCCESS) {
            if (handle_in->txn) {
                handle->txn = handle_in->txn;
                handle_in->txn = NULL;
            }
            // Close, unlink and free the caller's rollback handle.
            _fdb_kvs_close(handle_in);
            free(handle_in);
            // Link the newly opened handle into the file handle's list
            _fdb_kvs_createNLinkKVHandle(handle->fhandle, handle);
            handle->max_seqnum = 0;
            handle->seqnum = seqnum;
            // Set the newly opened rolled-back handle as caller's handle
            *handle_ptr = handle;
        } else {
            // cancel the rolling-back of the sequence number
            filemgr_mutex_lock(handle_in->file);
            filemgr_set_seqnum(handle_in->file, old_seqnum);
            filemgr_mutex_unlock(handle_in->file);
            free(handle);
            atomic_cas_uint8_t(&handle_in->handle_busy, 1, 0);
        }
    } else {
        free(handle);
        atomic_cas_uint8_t(&handle_in->handle_busy, 1, 0);
    }

    return fs;
}